

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void kname(Proto *p,int pc,int c,char **name)

{
  char *pcVar1;
  code *pcVar2;
  
  if (((uint)c >> 8 & 1) == 0) {
    pcVar1 = getobjname(p,pc,c,name);
    pcVar2 = (code *)0x1526fe;
    if ((pcVar1 != (char *)0x0) && (*pcVar1 == 'c')) {
      return;
    }
  }
  else if ((p->k[c & 0xfffffeffU].tt_ & 0xfU) == 4) {
    pcVar2 = p->k[c & 0xfffffeffU].value_.f + 0x18;
  }
  else {
    pcVar2 = (code *)0x1526fe;
  }
  *name = (char *)pcVar2;
  return;
}

Assistant:

static void kname (Proto *p, int pc, int c, const char **name) {
  if (ISK(c)) {  /* is 'c' a constant? */
    TValue *kvalue = &p->k[INDEXK(c)];
    if (ttisstring(kvalue)) {  /* literal constant? */
      *name = svalue(kvalue);  /* it is its own name */
      return;
    }
    /* else no reasonable name found */
  }
  else {  /* 'c' is a register */
    const char *what = getobjname(p, pc, c, name); /* search for 'c' */
    if (what && *what == 'c') {  /* found a constant name? */
      return;  /* 'name' already filled */
    }
    /* else no reasonable name found */
  }
  *name = "?";  /* no reasonable name found */
}